

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O0

void send_handle_and_close(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined1 local_1c [8];
  sockaddr_in addr;
  int r;
  
  loop = uv_default_loop();
  addr.sin_zero._0_4_ = uv_tcp_init(loop,&tcp_server);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x354,"r == 0");
    abort();
  }
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,(sockaddr_in *)local_1c);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x356,"0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)");
    abort();
  }
  addr.sin_zero._0_4_ = uv_tcp_bind(&tcp_server,(sockaddr *)local_1c,0);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x359,"r == 0");
    abort();
  }
  addr.sin_zero._0_4_ =
       uv_write2(&write_req,(uv_stream_t *)&channel,&large_buf,1,(uv_stream_t *)&tcp_server,
                 closed_handle_write_cb);
  if (addr.sin_zero._0_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
            ,0x361,"r == 0");
    abort();
  }
  uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
  return;
}

Assistant:

static void send_handle_and_close() {
  int r;
  struct sockaddr_in addr;

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  r = uv_write2(&write_req,
                (uv_stream_t*)&channel,
                &large_buf,
                1,
                (uv_stream_t*)&tcp_server,
                closed_handle_write_cb);
  ASSERT(r == 0);

  uv_close((uv_handle_t*)&tcp_server, NULL);
}